

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall
MinVR::VRDatumFloatArray::VRDatumFloatArray(VRDatumFloatArray *this,VRFloatArray *inVal)

{
  undefined8 *in_RDI;
  vector<float,_std::allocator<float>_> *in_stack_00000008;
  vector<float,_std::allocator<float>_> *in_stack_00000010;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd8;
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
  *in_stack_ffffffffffffffe0;
  
  std::vector<float,_std::allocator<float>_>::vector(in_stack_00000010,in_stack_00000008);
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::
  VRDatumSpecialized(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__VRDatumFloatArray_00179b48;
  return;
}

Assistant:

VRDatumFloatArray(const VRFloatArray inVal) :
    VRDatumSpecialized<VRFloatArray, VRCORETYPE_FLOATARRAY>(inVal) {}